

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::PatchableProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint cacheId,bool isCtor,
          bool registerCacheIdForCall)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot instance_00;
  undefined4 *puVar5;
  Phase tag;
  undefined3 in_register_00000089;
  ByteCodeWriter *this_00;
  CacheIdUnit local_54;
  CacheIdUnit unit;
  Type local_3a;
  RegSlot local_38;
  ProfileId profileId;
  OpCode op_local;
  
  unit.cacheId = CONCAT31(in_register_00000089,isCtor);
  profileId = op;
  CheckOpen(this);
  unique0x10000652 = this;
  CheckOp(this,op,(OpLayoutType)0x34);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x82b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_007cf584;
    *puVar5 = 0;
  }
  this_00 = stack0xffffffffffffffb8;
  local_38 = ConsumeReg(stack0xffffffffffffffb8,value);
  instance_00 = ConsumeReg(this_00,instance);
  local_3a = 0xffff;
  bVar3 = false;
  if (((op == InitLetFld) || (bVar3 = false, op == InitConstFld)) ||
     (bVar3 = false, op == InitClassMember)) goto LAB_007cf4bc;
  if (((op == LdFld) || (op == LdFld_ReuseLoc)) || (op == LdFldForTypeOf)) {
    if (((byte)unit.cacheId & registerCacheIdForCall) == 1) {
      local_54.isRootObjectCache = false;
      local_54.cacheId = cacheId;
      bVar3 = JsUtil::
              BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>(this_00->callRegToLdFldCacheIndexMap,&local_38,&local_54);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x84d,
                                    "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                    "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
        if (!bVar3) goto LAB_007cf584;
        *puVar5 = 0;
        this_00 = stack0xffffffffffffffb8;
      }
      JsUtil::
      BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00->callRegToLdFldCacheIndexMap,&local_38,&local_54);
    }
LAB_007cf322:
    bVar3 = DoDynamicProfileOpcode(this_00,AggressiveIntTypeSpecPhase,false);
    if (!bVar3) {
      bVar3 = DoDynamicProfileOpcode(this_00,FloatTypeSpecPhase,false);
      if (!bVar3) {
        bVar3 = DoDynamicProfileOpcode(this_00,ObjTypeSpecPhase,false);
        if (!bVar3) {
          bVar3 = DoDynamicProfileOpcode(this_00,InlinePhase,false);
          if (!bVar3) {
            tag = ProfileBasedFldFastPathPhase;
            goto LAB_007cf4a5;
          }
        }
      }
    }
LAB_007cf4b0:
    OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
LAB_007cf4b9:
    bVar3 = false;
  }
  else {
    if (op == LdFldForCallApplyTarget) goto LAB_007cf322;
    if (op == LdMethodFld) {
      if (registerCacheIdForCall) {
        local_54.isRootObjectCache = false;
        local_54.cacheId = cacheId;
        bVar3 = JsUtil::
                BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetValue<unsigned_int>
                          (this_00->callRegToLdFldCacheIndexMap,&local_38,&local_54);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x85f,
                                      "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                      "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
          if (!bVar3) goto LAB_007cf584;
          *puVar5 = 0;
          this_00 = stack0xffffffffffffffb8;
        }
        JsUtil::
        BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this_00->callRegToLdFldCacheIndexMap,&local_38,&local_54);
      }
LAB_007cf476:
      bVar3 = DoDynamicProfileOpcode(this_00,ProfileBasedFldFastPathPhase,false);
      if (!bVar3) {
        bVar3 = DoDynamicProfileOpcode(this_00,InlinePhase,false);
        if (bVar3) goto LAB_007cf4b0;
        tag = ObjTypeSpecPhase;
LAB_007cf4a5:
        bVar3 = false;
        bVar4 = DoDynamicProfileOpcode(this_00,tag,false);
        if (!bVar4) goto LAB_007cf4bc;
      }
      goto LAB_007cf4b0;
    }
    if (((op == StFld) || (op == StFldStrict)) || (op == InitFld)) goto LAB_007cf476;
    if (op != ScopedLdMethodFld) {
      if (op != LdLen_A) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x873,"(false)",
                                    "The specified OpCode is not intended for patchable field-access"
                                   );
        if (!bVar3) goto LAB_007cf584;
        *puVar5 = 0;
        bVar3 = false;
        this_00 = stack0xffffffffffffffb8;
        goto LAB_007cf4bc;
      }
      bVar3 = DoDynamicProfileOpcode(this_00,AggressiveIntTypeSpecPhase,false);
      if (!bVar3) {
        bVar3 = DoDynamicProfileOpcode(this_00,FloatTypeSpecPhase,false);
        if (!bVar3) {
          bVar3 = DoDynamicProfileOpcode(this_00,TypedArrayTypeSpecPhase,false);
          if (!bVar3) {
            bVar3 = DoDynamicProfileOpcode(this_00,ArrayCheckHoistPhase,false);
            if (!bVar3) {
              bVar3 = DoDynamicProfileOpcode(this_00,ObjTypeSpecPhase,false);
              if (!bVar3) {
                bVar3 = DoDynamicProfileOpcode(this_00,InlinePhase,false);
                if (!bVar3) {
                  bVar3 = false;
                  bVar4 = DoDynamicProfileOpcode(this_00,ProfileBasedFldFastPathPhase,false);
                  if (!bVar4) goto LAB_007cf4bc;
                }
              }
            }
          }
        }
      }
      TVar1 = this_00->m_functionWrite->profiledLdLenCount;
      if (TVar1 != 0xffff) {
        this_00->m_functionWrite->profiledLdLenCount = TVar1 + 1;
        local_3a = TVar1;
        OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
        bVar3 = true;
        goto LAB_007cf4bc;
      }
      goto LAB_007cf4b9;
    }
  }
LAB_007cf4bc:
  bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this_00,profileId,local_38,instance_00,cacheId);
  if (!bVar4) {
    bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this_00,profileId,local_38,instance_00,cacheId);
    if (!bVar4) {
      bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this_00,profileId,local_38,instance_00,cacheId);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x877,"(success)","success");
        if (!bVar4) {
LAB_007cf584:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        this_00 = stack0xffffffffffffffb8;
      }
    }
  }
  if (bVar3) {
    Data::Write(&this_00->m_byteCodeData,&local_3a,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableProperty(OpCode op, RegSlot value, RegSlot instance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        bool isProfiled = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        switch (op)
        {
        case OpCode::LdLen_A:
        {
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
                DoDynamicProfileOpcode(ArrayCheckHoistPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
                && this->m_functionWrite->AllocProfiledLdLenId(&profileId))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
                isProfiled = true;
            }
            break;
        }
        case OpCode::LdFldForTypeOf:
        case OpCode::LdFld:
        case OpCode::LdFld_ReuseLoc:
            if (isCtor) // The symbol loaded by this LdFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
        case OpCode::LdFldForCallApplyTarget:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
            // fall-through
        case OpCode::StFld:
        case OpCode::StFldStrict:
        case OpCode::InitFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitLetFld:
        case OpCode::InitConstFld:
        case OpCode::InitClassMember:
        case OpCode::ScopedLdMethodFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementCP, op, value, instance, cacheId);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }